

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression *
slang::ast::Expression::create
          (Compilation *compilation,ExpressionSyntax *syntax,ASTContext *ctx,
          bitmask<slang::ast::ASTFlags> extraFlags,Type *assignmentTarget)

{
  SyntaxKind kind;
  bool bVar1;
  InvalidExpression *pIVar2;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  DiagCode code;
  SourceRange sourceRange;
  ASTContext context;
  ASTContext local_60;
  Expression *local_28;
  
  ASTContext::resetFlags(&local_60,ctx,extraFlags);
  kind = (syntax->super_SyntaxNode).kind;
  if ((int)kind < 0x128) {
    if (0x9b < (int)kind) {
      if ((int)kind < 0xfa) {
        if ((int)kind < 0xba) {
          if (kind != DivideExpression) {
            if (kind == ElementSelectExpression) {
              pIVar2 = (InvalidExpression *)
                       bindSelectExpression
                                 (compilation,(ElementSelectExpressionSyntax *)syntax,&local_60);
              goto LAB_00405ebd;
            }
            if (kind == EmptyQueueExpression) {
              pIVar2 = (InvalidExpression *)
                       ConcatenationExpression::fromEmpty
                                 (compilation,(EmptyQueueExpressionSyntax *)syntax,&local_60,
                                  assignmentTarget);
              goto LAB_00405ebd;
            }
            goto switchD_00405ce6_caseD_22;
          }
        }
        else if ((1 < kind - GreaterThanEqualExpression) && (kind != EqualityExpression)) {
          if (kind == ExpressionOrDist) {
            pIVar2 = (InvalidExpression *)
                     DistExpression::fromSyntax
                               (compilation,(ExpressionOrDistSyntax *)syntax,&local_60);
            goto LAB_00405ebd;
          }
          goto switchD_00405ce6_caseD_22;
        }
        goto switchD_00405ce6_caseD_29;
      }
      switch(kind) {
      case InequalityExpression:
      case LessThanEqualExpression:
      case LessThanExpression:
      case LogicalAndExpression:
      case LogicalEquivalenceExpression:
      case LogicalImplicationExpression:
      case LogicalOrExpression:
      case LogicalShiftLeftExpression:
      case LogicalShiftRightExpression:
        goto switchD_00405ce6_caseD_29;
      default:
        goto switchD_00405ce6_caseD_22;
      case InsideExpression:
        pIVar2 = (InvalidExpression *)
                 InsideExpression::fromSyntax
                           (compilation,(InsideExpressionSyntax *)syntax,&local_60);
        break;
      case IntegerLiteralExpression:
        pIVar2 = (InvalidExpression *)
                 IntegerLiteral::fromSyntax(compilation,(LiteralExpressionSyntax *)syntax);
        break;
      case IntegerVectorExpression:
        pIVar2 = (InvalidExpression *)
                 IntegerLiteral::fromSyntax(compilation,(IntegerVectorExpressionSyntax *)syntax);
        break;
      case InvocationExpression:
        pIVar2 = (InvalidExpression *)
                 CallExpression::fromSyntax
                           (compilation,(InvocationExpressionSyntax *)syntax,
                            (ArrayOrRandomizeMethodExpressionSyntax *)0x0,&local_60);
        if ((pIVar2->super_Expression).syntax != (ExpressionSyntax *)0x0) {
          return &pIVar2->super_Expression;
        }
        break;
      case LogicalLeftShiftAssignmentExpression:
      case LogicalRightShiftAssignmentExpression:
        goto switchD_00405ce6_caseD_20;
      }
      goto LAB_00405ebd;
    }
    if ((int)kind < 0x20) {
      if ((int)kind < 0x13) {
        if (kind != AddAssignmentExpression) {
          if (kind == AddExpression) goto switchD_00405ce6_caseD_29;
          if (kind != AndAssignmentExpression) goto switchD_00405ce6_caseD_22;
        }
      }
      else if (1 < kind - ArithmeticLeftShiftAssignmentExpression) {
        if (1 < kind - ArithmeticShiftLeftExpression) {
          if (kind == ArrayOrRandomizeMethodExpression) {
            pIVar2 = (InvalidExpression *)
                     CallExpression::fromSyntax
                               (compilation,(ArrayOrRandomizeMethodExpressionSyntax *)syntax,
                                &local_60);
            goto LAB_00405ebd;
          }
          goto switchD_00405ce6_caseD_22;
        }
        goto switchD_00405ce6_caseD_29;
      }
      goto switchD_00405ce6_caseD_20;
    }
    if ((int)kind < 0x3b) {
      switch(kind) {
      case AssignmentExpression:
        goto switchD_00405ce6_caseD_20;
      case AssignmentPatternExpression:
        pIVar2 = (InvalidExpression *)
                 bindAssignmentPattern
                           (compilation,(AssignmentPatternExpressionSyntax *)syntax,&local_60,
                            assignmentTarget);
        goto LAB_00405ebd;
      case BadExpression:
switchD_00405ce6_caseD_26:
        local_28 = (Expression *)0x0;
        pIVar2 = BumpAllocator::
                 emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                           (&compilation->super_BumpAllocator,&local_28,compilation->errorType);
        goto LAB_00405ebd;
      case BinaryAndExpression:
      case BinaryOrExpression:
      case BinaryXnorExpression:
      case BinaryXorExpression:
        goto switchD_00405ce6_caseD_29;
      }
    }
    else if ((int)kind < 0x59) {
      if ((int)kind < 0x40) {
        if ((kind == CaseEqualityExpression) || (kind == CaseInequalityExpression))
        goto switchD_00405ce6_caseD_29;
      }
      else {
        if (kind == CastExpression) {
          pIVar2 = (InvalidExpression *)
                   ConversionExpression::fromSyntax
                             (compilation,(CastExpressionSyntax *)syntax,&local_60,assignmentTarget)
          ;
          goto LAB_00405ebd;
        }
        if (kind == ConcatenationExpression) {
          pIVar2 = (InvalidExpression *)
                   ConcatenationExpression::fromSyntax
                             (compilation,(ConcatenationExpressionSyntax *)syntax,&local_60,
                              assignmentTarget);
          goto LAB_00405ebd;
        }
      }
    }
    else if ((int)kind < 0x84) {
      if (kind == ConditionalExpression) {
        pIVar2 = (InvalidExpression *)
                 ConditionalExpression::fromSyntax
                           (compilation,(ConditionalExpressionSyntax *)syntax,&local_60,
                            assignmentTarget);
        goto LAB_00405ebd;
      }
      if (kind == CopyClassExpression) {
        pIVar2 = (InvalidExpression *)
                 CopyClassExpression::fromSyntax
                           (compilation,(CopyClassExpressionSyntax *)syntax,&local_60);
        goto LAB_00405ebd;
      }
    }
    else {
      if (kind == DefaultPatternKeyExpression) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        code.subsystem = General;
        code.code = 1;
        goto LAB_00405f75;
      }
      if (kind == DivideAssignmentExpression) goto switchD_00405ce6_caseD_20;
    }
    goto switchD_00405ce6_caseD_22;
  }
  if ((int)kind < 0x1ca) {
    if (0x170 < (int)kind) {
      if ((int)kind < 0x1aa) {
        if (kind - PostdecrementExpression < 2) {
          pIVar2 = (InvalidExpression *)
                   UnaryExpression::fromSyntax
                             (compilation,(PostfixUnaryExpressionSyntax *)syntax,&local_60);
          goto LAB_00405ebd;
        }
        if (kind != PowerExpression) {
          if (kind == RealLiteralExpression) {
            pIVar2 = (InvalidExpression *)
                     RealLiteral::fromSyntax(compilation,(LiteralExpressionSyntax *)syntax);
            goto LAB_00405ebd;
          }
          goto switchD_00405ce6_caseD_22;
        }
switchD_00405ce6_caseD_29:
        pIVar2 = (InvalidExpression *)
                 BinaryExpression::fromSyntax
                           (compilation,(BinaryExpressionSyntax *)syntax,&local_60);
        goto LAB_00405ebd;
      }
      switch(kind) {
      case StreamingConcatenationExpression:
        pIVar2 = (InvalidExpression *)
                 StreamingConcatenationExpression::fromSyntax
                           (compilation,(StreamingConcatenationExpressionSyntax *)syntax,&local_60);
        break;
      case StringLiteralExpression:
        pIVar2 = (InvalidExpression *)
                 StringLiteral::fromSyntax(&local_60,(LiteralExpressionSyntax *)syntax);
        break;
      case StringType:
      case StrongWeakPropertyExpr:
      case StructType:
      case StructUnionMember:
      case StructurePattern:
      case StructuredAssignmentPattern:
      case SuperHandle:
        goto switchD_00405ce6_caseD_22;
      case SubtractAssignmentExpression:
        goto switchD_00405ce6_caseD_20;
      case SubtractExpression:
        goto switchD_00405ce6_caseD_29;
      case SuperNewDefaultedArgsExpression:
        pIVar2 = (InvalidExpression *)
                 NewClassExpression::fromSyntax
                           (compilation,(SuperNewDefaultedArgsExpressionSyntax *)syntax,&local_60,
                            assignmentTarget);
        break;
      default:
        if (kind == SignedCastExpression) {
          pIVar2 = (InvalidExpression *)
                   ConversionExpression::fromSyntax
                             (compilation,(SignedCastExpressionSyntax *)syntax,&local_60);
          break;
        }
        goto switchD_00405ce6_caseD_22;
      }
      goto LAB_00405ebd;
    }
    switch(kind) {
    case MemberAccessExpression:
      pIVar2 = (InvalidExpression *)
               MemberAccessExpression::fromSyntax
                         (compilation,(MemberAccessExpressionSyntax *)syntax,
                          (InvocationExpressionSyntax *)0x0,
                          (ArrayOrRandomizeMethodExpressionSyntax *)0x0,&local_60);
      break;
    case MinTypMaxExpression:
      pIVar2 = (InvalidExpression *)
               MinTypMaxExpression::fromSyntax
                         (compilation,(MinTypMaxExpressionSyntax *)syntax,&local_60,assignmentTarget
                         );
      break;
    case ModAssignmentExpression:
    case MultiplyAssignmentExpression:
switchD_00405ce6_caseD_20:
      pIVar2 = (InvalidExpression *)
               AssignmentExpression::fromSyntax
                         (compilation,(BinaryExpressionSyntax *)syntax,&local_60);
      break;
    case ModExpression:
    case MultiplyExpression:
      goto switchD_00405ce6_caseD_29;
    case ModportClockingPort:
    case ModportDeclaration:
    case ModportExplicitPort:
    case ModportItem:
    case ModportNamedPort:
    case ModportSimplePortList:
    case ModportSubroutinePort:
    case ModportSubroutinePortList:
    case ModuleDeclaration:
    case ModuleHeader:
      goto switchD_00405ce6_caseD_22;
    case MultipleConcatenationExpression:
      pIVar2 = (InvalidExpression *)
               ReplicationExpression::fromSyntax
                         (compilation,(MultipleConcatenationExpressionSyntax *)syntax,&local_60);
      break;
    default:
      switch(kind) {
      case NewArrayExpression:
        pIVar2 = (InvalidExpression *)
                 NewArrayExpression::fromSyntax
                           (compilation,(NewArrayExpressionSyntax *)syntax,&local_60,
                            assignmentTarget);
        break;
      case NewClassExpression:
        pIVar2 = (InvalidExpression *)
                 NewClassExpression::fromSyntax
                           (compilation,(NewClassExpressionSyntax *)syntax,&local_60,
                            assignmentTarget);
        break;
      case NoUnconnectedDriveDirective:
      case NonAnsiPortList:
      case NonAnsiUdpPortList:
      case NonblockingEventTriggerStatement:
      case NumberPragmaExpression:
      case OneStepDelay:
        goto switchD_00405ce6_caseD_22;
      case NonblockingAssignmentExpression:
      case OrAssignmentExpression:
        goto switchD_00405ce6_caseD_20;
      case NullLiteralExpression:
        pIVar2 = (InvalidExpression *)
                 NullLiteral::fromSyntax(compilation,(LiteralExpressionSyntax *)syntax);
        break;
      default:
        if (kind == ParenthesizedExpression) {
          extraFlags_00.m_bits = extraFlags.m_bits | 8;
          if (((byte)local_60.flags.m_bits & 0x30) != 0) {
            extraFlags_00.m_bits = extraFlags.m_bits;
          }
          pIVar2 = (InvalidExpression *)
                   create(compilation,(ExpressionSyntax *)syntax[1].super_SyntaxNode.previewNode,
                          &local_60,extraFlags_00,assignmentTarget);
          break;
        }
        goto switchD_00405ce6_caseD_22;
      }
    }
  }
  else {
    if ((int)kind < 0x1e7) {
      if (kind == TaggedUnionExpression) {
        pIVar2 = (InvalidExpression *)
                 TaggedUnionExpression::fromSyntax
                           (compilation,(TaggedUnionExpressionSyntax *)syntax,&local_60,
                            assignmentTarget);
        goto LAB_00405ebd;
      }
      if (kind == TimeLiteralExpression) {
        pIVar2 = (InvalidExpression *)
                 TimeLiteral::fromSyntax(&local_60,(LiteralExpressionSyntax *)syntax);
        goto LAB_00405ebd;
      }
      if (kind == TimingControlExpression) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        code.subsystem = Expressions;
        code.code = 0x9e;
LAB_00405f75:
        ASTContext::addDiag(&local_60,code,sourceRange);
        goto switchD_00405ce6_caseD_26;
      }
      goto switchD_00405ce6_caseD_22;
    }
    switch(kind) {
    case UnaryBitwiseAndExpression:
    case UnaryBitwiseNandExpression:
    case UnaryBitwiseNorExpression:
    case UnaryBitwiseNotExpression:
    case UnaryBitwiseOrExpression:
    case UnaryBitwiseXnorExpression:
    case UnaryBitwiseXorExpression:
    case UnaryLogicalNotExpression:
    case UnaryMinusExpression:
    case UnaryPlusExpression:
    case UnaryPredecrementExpression:
    case UnaryPreincrementExpression:
      pIVar2 = (InvalidExpression *)
               UnaryExpression::fromSyntax
                         (compilation,(PrefixUnaryExpressionSyntax *)syntax,&local_60);
      break;
    case UnbasedUnsizedLiteralExpression:
      pIVar2 = (InvalidExpression *)
               UnbasedUnsizedIntegerLiteral::fromSyntax
                         (compilation,(LiteralExpressionSyntax *)syntax);
      break;
    case ValueRangeExpression:
      pIVar2 = (InvalidExpression *)
               ValueRangeExpression::fromSyntax
                         (compilation,(ValueRangeExpressionSyntax *)syntax,&local_60);
      break;
    case WildcardEqualityExpression:
    case WildcardInequalityExpression:
      goto switchD_00405ce6_caseD_29;
    case WildcardLiteralExpression:
      pIVar2 = (InvalidExpression *)
               UnboundedLiteral::fromSyntax(&local_60,(LiteralExpressionSyntax *)syntax);
      break;
    default:
      if (kind == XorAssignmentExpression) goto switchD_00405ce6_caseD_20;
    case UnaryConditionalDirectiveExpression:
    case UnaryPropertyExpr:
    case UnarySelectPropertyExpr:
    case UnconnectedDriveDirective:
    case UndefDirective:
    case UndefineAllDirective:
    case UnionType:
    case UniquenessConstraint:
    case UnitScope:
    case UntilPropertyExpr:
    case UntilWithPropertyExpr:
    case Untyped:
    case UserDefinedNetDeclaration:
    case VariableDimension:
    case VariablePattern:
    case VariablePortHeader:
    case VirtualInterfaceType:
    case VoidCastedCallStatement:
    case VoidType:
    case WaitForkStatement:
    case WaitOrderStatement:
    case WaitStatement:
    case WildcardDimensionSpecifier:
switchD_00405ce6_caseD_22:
      bVar1 = slang::syntax::NameSyntax::isKind(kind);
      if (bVar1) {
        pIVar2 = (InvalidExpression *)
                 bindName(compilation,(NameSyntax *)syntax,(InvocationExpressionSyntax *)0x0,
                          (ArrayOrRandomizeMethodExpressionSyntax *)0x0,&local_60);
      }
      else {
        slang::syntax::DataTypeSyntax::isKind((syntax->super_SyntaxNode).kind);
        pIVar2 = (InvalidExpression *)
                 DataTypeExpression::fromSyntax(compilation,(DataTypeSyntax *)syntax,&local_60);
      }
    }
  }
LAB_00405ebd:
  (pIVar2->super_Expression).syntax = syntax;
  return &pIVar2->super_Expression;
}

Assistant:

Expression& Expression::create(Compilation& compilation, const ExpressionSyntax& syntax,
                               const ASTContext& ctx, bitmask<ASTFlags> extraFlags,
                               const Type* assignmentTarget) {
    ASTContext context = ctx.resetFlags(extraFlags);
    Expression* result;
    switch (syntax.kind) {
        case SyntaxKind::BadExpression:
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::NullLiteralExpression:
            result = &NullLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::WildcardLiteralExpression:
            result = &UnboundedLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::StringLiteralExpression:
            result = &StringLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::RealLiteralExpression:
            result = &RealLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::TimeLiteralExpression:
            result = &TimeLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::IntegerLiteralExpression:
            result = &IntegerLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::UnbasedUnsizedLiteralExpression:
            result = &UnbasedUnsizedIntegerLiteral::fromSyntax(
                compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::IntegerVectorExpression:
            result = &IntegerLiteral::fromSyntax(compilation,
                                                 syntax.as<IntegerVectorExpressionSyntax>());
            break;
        case SyntaxKind::ParenthesizedExpression:
            // Parenthesis re-allows assignments if we're in a procedural statement.
            if (!context.flags.has(ASTFlags::NonProcedural) &&
                !context.flags.has(ASTFlags::AssignmentDisallowed)) {
                extraFlags |= ASTFlags::AssignmentAllowed;
            }

            result = &create(compilation, *syntax.as<ParenthesizedExpressionSyntax>().expression,
                             context, extraFlags, assignmentTarget);
            break;
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            result = &UnaryExpression::fromSyntax(compilation,
                                                  syntax.as<PrefixUnaryExpressionSyntax>(),
                                                  context);
            break;
        case SyntaxKind::PostincrementExpression:
        case SyntaxKind::PostdecrementExpression:
            result = &UnaryExpression::fromSyntax(compilation,
                                                  syntax.as<PostfixUnaryExpressionSyntax>(),
                                                  context);
            break;
        case SyntaxKind::AddExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::PowerExpression:
            result = &BinaryExpression::fromSyntax(compilation, syntax.as<BinaryExpressionSyntax>(),
                                                   context);
            break;
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
            result = &AssignmentExpression::fromSyntax(compilation,
                                                       syntax.as<BinaryExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::InvocationExpression:
            result = &CallExpression::fromSyntax(compilation,
                                                 syntax.as<InvocationExpressionSyntax>(), nullptr,
                                                 context);

            // The syntax node might have already been assigned after creating the
            // call expression, for cases like let decls that get expanded in place.
            // Return early to avoid overwriting that syntax node.
            if (result->syntax)
                return *result;
            break;
        case SyntaxKind::ConditionalExpression:
            result = &ConditionalExpression::fromSyntax(compilation,
                                                        syntax.as<ConditionalExpressionSyntax>(),
                                                        context, assignmentTarget);
            break;
        case SyntaxKind::InsideExpression:
            result = &InsideExpression::fromSyntax(compilation, syntax.as<InsideExpressionSyntax>(),
                                                   context);
            break;
        case SyntaxKind::MemberAccessExpression:
            result = &MemberAccessExpression::fromSyntax(compilation,
                                                         syntax.as<MemberAccessExpressionSyntax>(),
                                                         nullptr, nullptr, context);
            break;
        case SyntaxKind::ConcatenationExpression:
            result = &ConcatenationExpression::fromSyntax(
                compilation, syntax.as<ConcatenationExpressionSyntax>(), context, assignmentTarget);
            break;
        case SyntaxKind::EmptyQueueExpression:
            result = &ConcatenationExpression::fromEmpty(compilation,
                                                         syntax.as<EmptyQueueExpressionSyntax>(),
                                                         context, assignmentTarget);
            break;
        case SyntaxKind::MultipleConcatenationExpression:
            result = &ReplicationExpression::fromSyntax(
                compilation, syntax.as<MultipleConcatenationExpressionSyntax>(), context);
            break;
        case SyntaxKind::StreamingConcatenationExpression:
            result = &StreamingConcatenationExpression::fromSyntax(
                compilation, syntax.as<StreamingConcatenationExpressionSyntax>(), context);
            break;
        case SyntaxKind::ElementSelectExpression:
            result = &bindSelectExpression(compilation, syntax.as<ElementSelectExpressionSyntax>(),
                                           context);
            break;
        case SyntaxKind::CastExpression:
            result = &ConversionExpression::fromSyntax(compilation,
                                                       syntax.as<CastExpressionSyntax>(), context,
                                                       assignmentTarget);
            break;
        case SyntaxKind::SignedCastExpression:
            result = &ConversionExpression::fromSyntax(compilation,
                                                       syntax.as<SignedCastExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::AssignmentPatternExpression:
            result = &bindAssignmentPattern(compilation,
                                            syntax.as<AssignmentPatternExpressionSyntax>(), context,
                                            assignmentTarget);
            break;
        case SyntaxKind::ValueRangeExpression:
            result = &ValueRangeExpression::fromSyntax(compilation,
                                                       syntax.as<ValueRangeExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::ExpressionOrDist:
            result = &DistExpression::fromSyntax(compilation, syntax.as<ExpressionOrDistSyntax>(),
                                                 context);
            break;
        case SyntaxKind::TimingControlExpression:
            // Valid cases of this expression type are handled in AssignmentExpression.
            // If we reach this block here, the expression is invalid so always report
            // an error.
            context.addDiag(diag::TimingControlNotAllowed, syntax.sourceRange());
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::NewArrayExpression:
            result = &NewArrayExpression::fromSyntax(compilation,
                                                     syntax.as<NewArrayExpressionSyntax>(), context,
                                                     assignmentTarget);
            break;
        case SyntaxKind::NewClassExpression:
            result = &NewClassExpression::fromSyntax(compilation,
                                                     syntax.as<NewClassExpressionSyntax>(), context,
                                                     assignmentTarget);
            break;
        case SyntaxKind::SuperNewDefaultedArgsExpression:
            result = &NewClassExpression::fromSyntax(
                compilation, syntax.as<SuperNewDefaultedArgsExpressionSyntax>(), context,
                assignmentTarget);
            break;
        case SyntaxKind::CopyClassExpression:
            result = &CopyClassExpression::fromSyntax(compilation,
                                                      syntax.as<CopyClassExpressionSyntax>(),
                                                      context);
            break;
        case SyntaxKind::DefaultPatternKeyExpression:
            // This should not be reachable from any valid expression creation.
            context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::MinTypMaxExpression:
            result = &MinTypMaxExpression::fromSyntax(compilation,
                                                      syntax.as<MinTypMaxExpressionSyntax>(),
                                                      context, assignmentTarget);
            break;
        case SyntaxKind::ArrayOrRandomizeMethodExpression:
            result = &CallExpression::fromSyntax(
                compilation, syntax.as<ArrayOrRandomizeMethodExpressionSyntax>(), context);
            break;
        case SyntaxKind::TaggedUnionExpression:
            result = &TaggedUnionExpression::fromSyntax(compilation,
                                                        syntax.as<TaggedUnionExpressionSyntax>(),
                                                        context, assignmentTarget);
            break;
        default:
            if (NameSyntax::isKind(syntax.kind)) {
                result = &bindName(compilation, syntax.as<NameSyntax>(), nullptr, nullptr, context);
                break;
            }
            else if (DataTypeSyntax::isKind(syntax.kind)) {
                result = &DataTypeExpression::fromSyntax(compilation, syntax.as<DataTypeSyntax>(),
                                                         context);
                break;
            }
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}